

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

GCproto * fs_finish(LexState *ls,BCLine line)

{
  size_t sVar1;
  LexState *pt_00;
  ptrdiff_t argbase_00;
  ptrdiff_t argbase;
  GCproto *pt;
  size_t ofsvar;
  size_t ofsdbg;
  size_t ofsli;
  size_t ofsuv;
  size_t ofsk;
  size_t sizept;
  FuncState *pFStack_90;
  BCLine numline;
  FuncState *fs;
  lua_State *L;
  LexState *pLStack_78;
  BCLine line_local;
  LexState *ls_local;
  ulong *local_68;
  FuncState *local_60;
  undefined4 local_54;
  LexState *local_50;
  ulong *local_48;
  FuncState *local_40;
  undefined4 local_34;
  LexState *local_30;
  ulong *local_28;
  char *local_20;
  ulong *local_18;
  FuncState *local_10;
  
  fs = (FuncState *)ls->L;
  pFStack_90 = ls->fs;
  sizept._4_4_ = line - pFStack_90->linedefined;
  L._4_4_ = line;
  pLStack_78 = ls;
  fs_fixup_ret(pFStack_90);
  ofsuv = (ulong)pFStack_90->pc * 4 + (ulong)pFStack_90->nkgc * 8 + 0x6f & 0xfffffffffffffff8;
  ofsli = (ulong)pFStack_90->nkn * 8 + ofsuv;
  ofsdbg = (long)(int)((pFStack_90->nuv + 1 & 0xfffffffe) << 1) + ofsli;
  ofsk = ofsdbg;
  sVar1 = fs_prep_line(pFStack_90,sizept._4_4_);
  ofsvar = sVar1 + ofsk;
  ofsk = ofsvar;
  sVar1 = fs_prep_var(pLStack_78,pFStack_90,(size_t *)&pt);
  ofsk = sVar1 + ofsk;
  pt_00 = (LexState *)lj_mem_newgco((lua_State *)fs,ofsk & 0xffffffff);
  *(uint8_t *)((long)&pt_00->L + 1) = '\a';
  pt_00->lookahead = (MSize)ofsk;
  *(uint16_t *)&pt_00->field_0x3e = 0;
  pt_00->field_0x3d = pFStack_90->flags & 0x9f;
  *(uint8_t *)((long)&pt_00->L + 2) = pFStack_90->numparams;
  *(uint8_t *)((long)&pt_00->L + 3) = pFStack_90->framesize;
  (pt_00->sb).w = (char *)pLStack_78->chunkname;
  *(undefined4 *)((long)pt_00 + (ulong)(pFStack_90->nkgc + 1) * -8 + ofsuv) = 0;
  fs_fixup_bc(pFStack_90,(GCproto *)pt_00,(BCIns *)&pt_00->rdata,pFStack_90->pc);
  fs_fixup_k(pFStack_90,(GCproto *)pt_00,(void *)((long)&((GCRef *)&pt_00->fs)->gcptr64 + ofsuv));
  fs_fixup_uv1(pFStack_90,(GCproto *)pt_00,
               (uint16_t *)((long)&((GCRef *)&pt_00->fs)->gcptr64 + ofsli));
  fs_fixup_line(pFStack_90,(GCproto *)pt_00,(void *)((long)&((GCRef *)&pt_00->fs)->gcptr64 + ofsdbg)
                ,sizept._4_4_);
  fs_fixup_var(pLStack_78,(GCproto *)pt_00,
               (uint8_t *)((long)&((GCRef *)&pt_00->fs)->gcptr64 + ofsvar),(size_t)pt);
  if ((((ulong)fs->L[1].base & 0x1000000) != 0) &&
     (argbase_00 = lj_vmevent_prepare((lua_State *)fs,LJ_VMEVENT_BC), argbase_00 != 0)) {
    local_68 = *(ulong **)&fs->pc;
    *(ulong **)&fs->pc = local_68 + 1;
    local_60 = fs;
    local_40 = fs;
    local_54 = 0xfffffff8;
    local_34 = 0xfffffff8;
    *local_68 = (ulong)pt_00 | 0xfffc000000000000;
    local_10 = fs;
    local_20 = "store to dead GC object";
    ls_local = pt_00;
    local_50 = pt_00;
    local_48 = local_68;
    local_30 = pt_00;
    local_28 = local_68;
    local_18 = local_68;
    lj_vmevent_call((lua_State *)fs,argbase_00);
  }
  *(long *)&fs->pc = *(long *)&fs->pc + -8;
  pLStack_78->vtop = pFStack_90->vbase;
  pLStack_78->fs = pFStack_90->prev;
  return (GCproto *)pt_00;
}

Assistant:

static GCproto *fs_finish(LexState *ls, BCLine line)
{
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  BCLine numline = line - fs->linedefined;
  size_t sizept, ofsk, ofsuv, ofsli, ofsdbg, ofsvar;
  GCproto *pt;

  /* Apply final fixups. */
  fs_fixup_ret(fs);

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = sizeof(GCproto) + fs->pc*sizeof(BCIns) + fs->nkgc*sizeof(GCRef);
  sizept = (sizept + sizeof(TValue)-1) & ~(sizeof(TValue)-1);
  ofsk = sizept; sizept += fs->nkn*sizeof(TValue);
  ofsuv = sizept; sizept += ((fs->nuv+1)&~1)*2;
  ofsli = sizept; sizept += fs_prep_line(fs, numline);
  ofsdbg = sizept; sizept += fs_prep_var(ls, fs, &ofsvar);

  /* Allocate prototype and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->sizept = (MSize)sizept;
  pt->trace = 0;
  pt->flags = (uint8_t)(fs->flags & ~(PROTO_HAS_RETURN|PROTO_FIXUP_RETURN));
  pt->numparams = fs->numparams;
  pt->framesize = fs->framesize;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(fs->nkgc+1)) = 0;
  fs_fixup_bc(fs, pt, (BCIns *)((char *)pt + sizeof(GCproto)), fs->pc);
  fs_fixup_k(fs, pt, (void *)((char *)pt + ofsk));
  fs_fixup_uv1(fs, pt, (uint16_t *)((char *)pt + ofsuv));
  fs_fixup_line(fs, pt, (void *)((char *)pt + ofsli), numline);
  fs_fixup_var(ls, pt, (uint8_t *)((char *)pt + ofsdbg), ofsvar);

  lj_vmevent_send(L, BC,
    setprotoV(L, L->top++, pt);
  );

  L->top--;  /* Pop table of constants. */
  ls->vtop = fs->vbase;  /* Reset variable stack. */
  ls->fs = fs->prev;
  lj_assertL(ls->fs != NULL || ls->tok == TK_eof, "bad parser state");
  return pt;
}